

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void __thiscall clunk::Node::GetPawnMoves<true,true>(Node *this,int from,int depth)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  MoveType type;
  uint pc;
  uint cap;
  uint to;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x617,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x618,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  pcVar2 = (char *)(&_board)[(uint)from];
  if (pcVar2 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x619,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if (*pcVar2 != '\x03') {
    __assert_fail("_board[from]->type == (color|Pawn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61a,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if ((uint)(byte)pcVar2[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61b,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  iVar4 = GetPinDir(this,true,from);
  uVar15 = 0;
  if (depth == 0) {
    uVar5 = GetDiscoverDir(this,true,from);
    uVar15 = uVar5 + 0x10 & 0xffffffdf;
    if (uVar15 != 0) {
      uVar15 = uVar5;
    }
  }
  uVar16 = (ulong)(from | 8);
  uVar14 = *(ulong *)(_pawnCaps + uVar16 * 8);
  do {
    if (uVar14 == 0) {
      if ((uint)from >> 4 == 1 || depth == 0) {
        uVar5 = from - 0x10;
        if (iVar4 != 0) {
          iVar7 = Direction(from,uVar5);
          iVar6 = -iVar7;
          if (0 < iVar7) {
            iVar6 = iVar7;
          }
          if (iVar6 != iVar4) {
            return;
          }
        }
        if ((undefined *)(&_board)[(int)uVar5] == _EMPTY) {
          if (from - 1U < 0x1f) {
            AddMove(this,PawnMove,from,uVar5,0x3cf,0,0xb);
            if (depth != 0) {
              return;
            }
            type = PawnMove;
            AddMove(this,PawnMove,from,uVar5,500,0,9);
            AddMove(this,PawnMove,from,uVar5,0x140,0,7);
            iVar6 = 5;
            iVar4 = 300;
          }
          else {
            if (depth != 0) {
              __assert_fail("!depth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x658,
                            "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                           );
            }
            if ((from - 0x1fU == (uint)(byte)_KING[1] || from - 0x21U == (uint)(byte)_KING[1]) ||
                uVar15 != 0) {
              AddMove(this,PawnMove,from,uVar5,
                      (*(int *)(_DIR_SHIFT + (long)from * 4 + 0x70) -
                      *(int *)(_PAWN_SQR + uVar16 * 4)) + 0x19,0,0);
            }
            if ((uint)from >> 4 != 6) {
              return;
            }
            uVar5 = from - 0x20;
            if ((undefined *)(&_board)[uVar5] != _EMPTY) {
              return;
            }
            if (uVar15 == 0 &&
                (from - 0x2fU != (uint)(byte)_KING[1] && from - 0x31U != (uint)(byte)_KING[1])) {
              return;
            }
            iVar4 = (*(int *)(_PAWN_SQR + (ulong)(from - 0x18) * 4) -
                    *(int *)(_PAWN_SQR + uVar16 * 4)) + 0x1e;
            iVar6 = 0;
            type = PawnLung;
          }
          AddMove(this,type,from,uVar5,iVar4,0,iVar6);
        }
      }
      return;
    }
    if ((uVar14 & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x629,
                    "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                   );
    }
    uVar5 = (uint)(uVar14 & 0xff);
    to = uVar5 - 1;
    iVar6 = Distance(from,to);
    if (iVar6 != 1) {
      __assert_fail("Distance(from, to) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x62b,
                    "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                   );
    }
    iVar6 = Direction(from,to);
    iVar7 = Direction(from,to);
    iVar8 = Direction(from,to);
    iVar9 = Direction(from,to);
    iVar10 = Direction(from,to);
    iVar11 = Direction(from,to);
    iVar12 = Direction(from,to);
    iVar13 = Direction(from,to);
    if ((((iVar6 != -0x11) && (iVar7 != -0xf)) && (iVar8 != 0xf)) &&
       (((iVar9 != 0x11 && (iVar10 != -0x10)) &&
        ((iVar11 != -1 && ((iVar12 != 1 && (iVar13 != 0x10)))))))) {
      __assert_fail("IS_DIR(Direction(from, to))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x62c,
                    "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                   );
    }
    if (iVar4 == 0) {
LAB_0012e25e:
      bVar1 = *(byte *)(&_board)[to];
      if ((bVar1 == 0) && ((byte *)(&_board)[to] != _EMPTY)) {
        __assert_fail("cap || (_board[to] == _EMPTY)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x631,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      pc = (uint)bVar1;
      if (pc == 0) {
        if (((this->ep != 0x78) && (to == this->ep)) &&
           (bVar3 = EpPinned<true>(from,uVar5 + 0xf), !bVar3)) {
          iVar7 = 0;
          iVar6 = 100;
          cap = 0;
          goto LAB_0012e38e;
        }
      }
      else if ((bVar1 & 1) == 0) {
        iVar6 = ValueOf(pc);
        cap = (uint)bVar1;
        if (uVar5 < 0x11) {
          AddMove(this,PawnCap,from,to,iVar6 + 0x3cf,pc,0xb);
          if (depth != 0) goto LAB_0012e393;
          AddMove(this,PawnCap,from,to,iVar6 + 500,cap,9);
          AddMove(this,PawnCap,from,to,iVar6 + 0x140,cap,7);
          iVar6 = iVar6 + 300;
          iVar7 = 5;
        }
        else {
          iVar7 = 0;
        }
LAB_0012e38e:
        AddMove(this,PawnCap,from,to,iVar6,cap,iVar7);
      }
    }
    else {
      iVar7 = Direction(from,to);
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar6 == iVar4) goto LAB_0012e25e;
    }
LAB_0012e393:
    uVar14 = uVar14 >> 8;
  } while( true );
}

Assistant:

void GetPawnMoves(const int from, const int depth) {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|Pawn));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    int score;
    int to;

    int kdir = 0;
    if (qsearch & (!depth)) {
      kdir = GetDiscoverDir(color, from);
      if (abs(kdir) == North) {
        kdir = 0;
      }
    }

    for (uint64_t mvs = _pawnCaps[from + (color * 8)]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      to = ((mvs & 0xFF) - 1);
      assert(Distance(from, to) == 1);
      assert(IS_DIR(Direction(from, to)));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        continue;
      }
      const int cap = _board[to]->type;
      assert(cap || (_board[to] == _EMPTY));
      if (!cap) {
        if ((ep != None) && (to == ep) &&
            !EpPinned<color>(from, (ep + (color ? North : South))))
        {
          AddMove(PawnCap, from, to, PawnValue);
        }
      }
      else if (COLOR(cap) != color) {
        score = ValueOf(cap);
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnCap, from, to, (score + QueenValue),  cap, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnCap, from, to, (score + RookValue),   cap, (color|Rook));
            AddMove(PawnCap, from, to, (score + BishopValue), cap, (color|Bishop));
            AddMove(PawnCap, from, to, (score + KnightValue), cap, (color|Knight));
          }
        }
        else {
          AddMove(PawnCap, from, to, score, cap);
        }
      }
    }
    if (!qsearch || ((!depth) | (YC(from) == (color ? 1 : 6)))) {
      to = (from + (color ? South : North));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        return;
      }
      if (_board[to] == _EMPTY) {
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnMove, from, to, QueenValue,  0, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnMove, from, to, RookValue,   0, (color|Rook));
            AddMove(PawnMove, from, to, BishopValue, 0, (color|Bishop));
            AddMove(PawnMove, from, to, KnightValue, 0, (color|Knight));
          }
        }
        else {
          if (qsearch) {
            assert(!depth);
            if (kdir |
                ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
            {
              score = (_PAWN_SQR[to + (8 * color)] -
                       _PAWN_SQR[from + (8 * color)] + 25);
              AddMove(PawnMove, from, to, score);
            }
          }
          else {
            score = (_PAWN_SQR[to + (8 * color)] -
                     _PAWN_SQR[from + (8 * color)] + 5);
            AddMove(PawnMove, from, to, score);
          }
          if (YC(from) == (color ? 6 : 1)) {
            to += (color ? South : North);
            assert(IS_SQUARE(to));
            if (_board[to] == _EMPTY) {
              if (qsearch) {
                assert(!depth);
                if (kdir |
                    ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                    ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
                {
                  score = (_PAWN_SQR[to + (8 * color)] -
                           _PAWN_SQR[from + (8 * color)] + 30);
                  AddMove(PawnLung, from, to, score);
                }
              }
              else {
                score = (_PAWN_SQR[to + (8 * color)] -
                         _PAWN_SQR[from + (8 * color)] + 10);
                AddMove(PawnLung, from, to, score);
              }
            }
          }
        }
      }
    }
  }